

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O0

int USHAHashSize(SHAversion whichSha)

{
  int local_c;
  SHAversion whichSha_local;
  
  switch(whichSha) {
  case SHA1:
    local_c = 0x14;
    break;
  case SHA224:
    local_c = 0x1c;
    break;
  case SHA256:
    local_c = 0x20;
    break;
  case SHA384:
    local_c = 0x30;
    break;
  default:
    local_c = 0x40;
  }
  return local_c;
}

Assistant:

int USHAHashSize(enum SHAversion whichSha)
{
    switch (whichSha) {
    case SHA1:   return SHA1HashSize;
    case SHA224: return SHA224HashSize;
    case SHA256: return SHA256HashSize;
    case SHA384: return SHA384HashSize;
    default:
    case SHA512: return SHA512HashSize;
    }
}